

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall re2::Compiler::Alt(Compiler *this,Frag a,Frag b)

{
  uint uVar1;
  PatchList PVar2;
  byte bVar3;
  Compiler *this_00;
  uint32_t out;
  Frag FVar4;
  uint local_68;
  uint32_t uStack_64;
  uint32_t uStack_60;
  undefined4 uStack_5c;
  Frag b_local;
  Frag a_local;
  
  out = a.begin;
  local_68 = b.begin;
  if (out == 0) {
    uStack_64 = b.end.head;
    uStack_60 = b.end.tail;
    uStack_5c = b._12_4_;
  }
  else if (local_68 == 0) {
    uStack_64 = a.end.head;
    uStack_60 = a.end.tail;
    uStack_5c = a._12_4_;
    local_68 = out;
  }
  else {
    this_00 = this;
    uVar1 = AllocInst(this,1);
    if ((int)uVar1 < 0) {
      FVar4 = NoMatch(this_00);
      local_68 = FVar4.begin;
      uStack_64 = FVar4.end.head;
      uStack_60 = FVar4.end.tail;
      uStack_5c = CONCAT31(uStack_5c._1_3_,FVar4.nullable);
    }
    else {
      Prog::Inst::InitAlt((this->inst_).ptr_._M_t.
                          super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar1,out,
                          local_68);
      PVar2 = PatchList::Append((this->inst_).ptr_._M_t.
                                super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                ._M_t.
                                super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl,a.end,
                                b.end);
      bVar3 = 1;
      if ((a._8_8_ >> 0x20 & 1) == 0) {
        bVar3 = b.nullable & 1;
      }
      uStack_64 = PVar2.head;
      uStack_60 = PVar2.tail;
      uStack_5c = CONCAT31(uStack_5c._1_3_,bVar3);
      local_68 = uVar1;
    }
  }
  FVar4.end.head = uStack_64;
  FVar4.begin = local_68;
  FVar4.end.tail = uStack_60;
  FVar4._12_4_ = uStack_5c;
  return FVar4;
}

Assistant:

Frag Compiler::Alt(Frag a, Frag b) {
  // Special case for convenience in loops.
  if (IsNoMatch(a))
    return b;
  if (IsNoMatch(b))
    return a;

  int id = AllocInst(1);
  if (id < 0)
    return NoMatch();

  inst_[id].InitAlt(a.begin, b.begin);
  return Frag(id, PatchList::Append(inst_.data(), a.end, b.end),
              a.nullable || b.nullable);
}